

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::comparatorInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,Token *instruction,
          int frame)

{
  int comparator;
  int property;
  Molecule *mol;
  Atom *sd;
  RigidBody *sd_00;
  pointer ppAVar1;
  pointer ppRVar2;
  float comparisonValue;
  SelectionSet bs;
  MoleculeIterator mi;
  SelectionSet local_50;
  MoleculeIterator local_38;
  
  comparator = instruction->tok;
  property = instruction->intValue;
  comparisonValue = std::any_cast<float>(&instruction->value);
  createSelectionSets(&local_50,this);
  SelectionSet::clearAll(&local_50);
  local_38._M_node = (_Base_ptr)0x0;
  mol = SimInfo::beginMolecule(this->info,&local_38);
  while (mol != (Molecule *)0x0) {
    compareProperty(this,mol,&local_50,property,comparator,comparisonValue,frame);
    ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar1 !=
        (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021bef4;
    sd = (Atom *)0x0;
    while (sd != (Atom *)0x0) {
      compareProperty(this,&sd->super_StuntDouble,&local_50,property,comparator,comparisonValue,
                      frame);
      ppAVar1 = ppAVar1 + 1;
      sd = (Atom *)0x0;
      if (ppAVar1 !=
          (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021bef4:
        sd = *ppAVar1;
      }
    }
    ppRVar2 = (mol->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar2 !=
        (mol->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021bf3f;
    sd_00 = (RigidBody *)0x0;
    while (sd_00 != (RigidBody *)0x0) {
      compareProperty(this,&sd_00->super_StuntDouble,&local_50,property,comparator,comparisonValue,
                      frame);
      ppRVar2 = ppRVar2 + 1;
      sd_00 = (RigidBody *)0x0;
      if (ppRVar2 !=
          (mol->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021bf3f:
        sd_00 = *ppRVar2;
      }
    }
    mol = SimInfo::nextMolecule(this->info,&local_38);
  }
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_50);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_50.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::comparatorInstruction(
      const Token& instruction, int frame) {
    int comparator        = instruction.tok;
    int property          = instruction.intValue;
    float comparisonValue = std::any_cast<float>(instruction.value);
    SelectionSet bs       = createSelectionSets();
    bs.clearAll();

    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      compareProperty(mol, bs, property, comparator, comparisonValue, frame);

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        compareProperty(atom, bs, property, comparator, comparisonValue, frame);
      }

      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        compareProperty(rb, bs, property, comparator, comparisonValue, frame);
      }
    }

    return bs.parallelReduce();
  }